

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

void ssh2_got_user_input(ConnectionLayer *cl)

{
  LogContext *pLVar1;
  size_t sVar2;
  ptrlen pVar3;
  
  pLVar1 = cl[-0xc].logctx;
  while ((pLVar1 != (LogContext *)0x0 && (sVar2 = bufchain_size((bufchain *)cl[-10].vt), sVar2 != 0)
         )) {
    pVar3 = bufchain_prefix((bufchain *)cl[-10].vt);
    (**(code **)(cl[-0xc].vt)->rportfwd_alloc)(cl[-0xc].vt,0,pVar3.ptr,pVar3.len);
    bufchain_consume((bufchain *)cl[-10].vt,pVar3.len);
    pLVar1 = cl[-0xc].logctx;
  }
  return;
}

Assistant:

static void ssh2_got_user_input(ConnectionLayer *cl)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);

    while (s->mainchan && bufchain_size(s->user_input) > 0) {
        /*
         * Add user input to the main channel's buffer.
         */
        ptrlen data = bufchain_prefix(s->user_input);
        sshfwd_write(s->mainchan_sc, data.ptr, data.len);
        bufchain_consume(s->user_input, data.len);
    }
}